

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_base_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  _Rb_tree_color _Var2;
  pointer pVVar3;
  pointer ppEVar4;
  key_type *__k;
  Row_container *pRVar5;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *pvVar6;
  bool bVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer ppEVar11;
  uint uVar12;
  _Base_ptr p_Var13;
  pair<std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::_Rb_tree_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  pVar14;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  undefined1 local_328 [24];
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  EStack_310;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_308;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_300;
  undefined4 local_2f4;
  char *local_2f0;
  char *local_2e8;
  shared_count sStack_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  char **local_2c0;
  long local_2b8;
  void *local_2b0;
  undefined4 local_2a8;
  long local_2a0;
  uint local_298;
  long local_290;
  undefined4 *local_288;
  long *local_280;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *local_278;
  undefined **local_270;
  ulong local_268;
  shared_count sStack_260;
  char *local_258;
  char *local_250;
  char *local_248;
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  setcont;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setcont._M_t._M_impl.super__Rb_tree_header._M_header;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setcont._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0 = (void *)0x0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_298 = 0;
  local_290 = 0;
  local_328._0_4_ = 0xffffffff;
  local_328._4_4_ = 0;
  local_328._8_8_ = 0x1ffffffff;
  local_328._16_8_ = (_Bit_type *)0x2ffffffff;
  EStack_310.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  EStack_310.rowIndex_ = 5;
  local_308.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_308.rowIndex_ = 6;
  setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setcont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_328,&local_300);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&setcont);
  local_328._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,local_328);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x327);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&(pVVar3->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 !=
        (pVVar3->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = ppEVar11[-1]->rowIndex_ + 1;
      goto LAB_0017baab;
    }
    local_328._16_8_ = (_Bit_type *)0x0;
    EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
    EStack_310.rowIndex_ = 0;
    local_328._0_4_ = 0;
    local_328._4_4_ = 0;
    local_328._8_8_ = 0;
    local_308.super_Entry_column_index_option.columnIndex_ = 0;
    local_308.rowIndex_ = 0;
  }
  else {
LAB_0017baab:
    local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8
               ,(allocator_type *)&local_2f0);
    ppEVar11 = (pVVar3->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar11 !=
        *(pointer *)
         ((long)&(pVVar3->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar12 <= (*ppEVar11)->rowIndex_) break;
        local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(pVVar3->erasedValues_)._M_h,(key_type *)&local_2d8);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               *(pointer *)
                ((long)&(pVVar3->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if ((ulong)EStack_310.super_Entry_column_index_option.columnIndex_ +
      (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar7 = false;
  }
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2c0 = &local_2f0;
  local_2f0 = "matrix[0].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_60,0x327,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x329);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&(pVVar3->column_).
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&(pVVar3->column_).
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              (pVVar3->erasedValues_)._M_h._M_element_count;
  local_280 = &local_2b8;
  local_288 = &local_2f4;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 3);
  local_2f4 = 3;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  local_328._0_4_ = 0xffffffff;
  local_328._4_4_ = 0;
  local_328._8_8_ = 0x1ffffffff;
  local_328._16_8_ = (_Bit_type *)0x2ffffffff;
  EStack_310.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  EStack_310.rowIndex_ = 5;
  local_308.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  local_308.rowIndex_ = 6;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_328,&local_300);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&setcont);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x330);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&pVVar3[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 !=
        pVVar3[1].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = ppEVar11[-1]->rowIndex_ + 1;
      goto LAB_0017be41;
    }
    local_328._16_8_ = (_Bit_type *)0x0;
    EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
    EStack_310.rowIndex_ = 0;
    local_328._0_4_ = 0;
    local_328._4_4_ = 0;
    local_328._8_8_ = 0;
    local_308.super_Entry_column_index_option.columnIndex_ = 0;
    local_308.rowIndex_ = 0;
  }
  else {
LAB_0017be41:
    local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8
               ,(allocator_type *)&local_2f0);
    ppEVar11 = pVVar3[1].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar11 !=
        *(pointer *)
         ((long)&pVVar3[1].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar12 <= (*ppEVar11)->rowIndex_) break;
        local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar3[1].erasedValues_._M_h,(key_type *)&local_2d8);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               *(pointer *)
                ((long)&pVVar3[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_00.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if ((ulong)EStack_310.super_Entry_column_index_option.columnIndex_ +
      (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar7 = false;
  }
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "matrix[1].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2f0;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_b0,0x330,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x332);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&pVVar3[1].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[1].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[1].erasedValues_._M_h._M_element_count;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 0);
  local_2f4 = 0;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_2d0 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_280 = &local_2b8;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_288 = &local_2f4;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,&local_270,&local_250,0x332,1,2,2,"matrix[1].size()",local_328,"0",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),&setcont);
  local_328._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,local_328);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x338);
  pVVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  local_278 = matrix;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&pVVar3[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 !=
        pVVar3[4].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = ppEVar11[-1]->rowIndex_ + 1;
      goto LAB_0017c1e4;
    }
    local_328._16_8_ = (_Bit_type *)0x0;
    EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
    EStack_310.rowIndex_ = 0;
    local_328._0_4_ = 0;
    local_328._4_4_ = 0;
    local_328._8_8_ = 0;
    local_308.super_Entry_column_index_option.columnIndex_ = 0;
    local_308.rowIndex_ = 0;
  }
  else {
LAB_0017c1e4:
    local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8
               ,(allocator_type *)&local_2f0);
    ppEVar11 = pVVar3[4].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar11 !=
        *(pointer *)
         ((long)&pVVar3[4].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar12 <= (*ppEVar11)->rowIndex_) break;
        local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar3[4].erasedValues_._M_h,(key_type *)&local_2d8);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               *(pointer *)
                ((long)&pVVar3[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_01.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if (((ulong)EStack_310 & 0xffffffff) + (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar7 = false;
  }
  pvVar6 = local_278;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "matrix[4].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  local_2c0 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_100,0x338,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x33a);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&pVVar3[4].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[4].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[4].erasedValues_._M_h._M_element_count;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 3);
  local_2f4 = 3;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_2d0 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_280 = &local_2b8;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_288 = &local_2f4;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,&local_270,&local_250,0x33a,1,2,2,"matrix[4].size()",local_328,"3",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)0x0,(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                     *)0x0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((pvVar6->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont);
  local_328._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,local_328);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x340);
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = ppEVar11[-1]->rowIndex_ + 1;
      goto LAB_0017c59f;
    }
    local_328._16_8_ = (_Bit_type *)0x0;
    EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
    EStack_310.rowIndex_ = 0;
    local_328._0_4_ = 0;
    local_328._4_4_ = 0;
    local_328._8_8_ = 0;
    local_308.super_Entry_column_index_option.columnIndex_ = 0;
    local_308.rowIndex_ = 0;
  }
  else {
LAB_0017c59f:
    local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8
               ,(allocator_type *)&local_2f0);
    ppEVar11 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar11 !=
        *(pointer *)
         ((long)&pVVar3[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar12 <= (*ppEVar11)->rowIndex_) break;
        local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar3[5].erasedValues_._M_h,(key_type *)&local_2d8);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_02.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if (((ulong)EStack_310 & 0xffffffff) + (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar7 = false;
  }
  pvVar6 = local_278;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "matrix[5].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  local_2c0 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_150,0x340,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x342);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&pVVar3[5].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[5].erasedValues_._M_h._M_element_count;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 5);
  local_2f4 = 5;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_2d0 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_280 = &local_2b8;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_288 = &local_2f4;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,&local_270,&local_250,0x342,1,2,2,"matrix[5].size()",local_328,"5",
             &local_2d8);
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  local_328._0_4_ = 0xffffffff;
  local_328._4_4_ = 2;
  local_328._8_8_ = 0x3ffffffff;
  local_328._16_8_ = (_Bit_type *)0x6ffffffff;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_328,&EStack_310);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((pvVar6->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&setcont);
  local_328._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,local_328);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x348);
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 !=
        pVVar3[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = ppEVar11[-1]->rowIndex_ + 1;
      goto LAB_0017c976;
    }
    local_328._16_8_ = (_Bit_type *)0x0;
    EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
    EStack_310.rowIndex_ = 0;
    local_328._0_4_ = 0;
    local_328._4_4_ = 0;
    local_328._8_8_ = 0;
    local_308.super_Entry_column_index_option.columnIndex_ = 0;
    local_308.rowIndex_ = 0;
  }
  else {
LAB_0017c976:
    local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8
               ,(allocator_type *)&local_2f0);
    ppEVar11 = pVVar3[5].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar11 !=
        *(pointer *)
         ((long)&pVVar3[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar12 <= (*ppEVar11)->rowIndex_) break;
        local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
        cVar8 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar3[5].erasedValues_._M_h,(key_type *)&local_2d8);
        if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
        }
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               *(pointer *)
                ((long)&pVVar3[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if (((ulong)EStack_310 & 0xffffffff) + (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar7 = false;
  }
  pvVar6 = local_278;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "matrix[5].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_2c0 = &local_2f0;
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_1a0,0x348,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x34a);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&pVVar3[5].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[5].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[5].erasedValues_._M_h._M_element_count;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 4);
  local_2f4 = 4;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_2d0 = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_280 = &local_2b8;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_288 = &local_2f4;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  local_328._0_4_ = 0xffffffff;
  local_328._4_4_ = 0;
  local_328._8_8_ = 0x1ffffffff;
  local_328._16_8_ = (_Bit_type *)0x3ffffffff;
  EStack_310.super_Entry_column_index_option.columnIndex_ = 0xffffffff;
  EStack_310.rowIndex_ = 5;
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
  ::
  _M_assign_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>const*>
            ((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>
              *)&setcont,
             (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              *)local_328,&local_308);
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = pVVar3[3].column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = *(pointer *)
             ((long)&pVVar3[3].column_.
                     super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                     ._M_impl + 8);
  if (ppEVar11 != ppEVar4) {
    do {
      __k = *ppEVar11;
      pRVar5 = pVVar3[3].super_Row_access_option.rows_;
      if (pRVar5 != (Row_container *)0x0) {
        p_Var9 = *(_Base_ptr *)((long)&(pRVar5->_M_t)._M_impl.super__Rb_tree_header + 8);
        p_Var13 = &(pRVar5->_M_t)._M_impl.super__Rb_tree_header._M_header;
        if (p_Var9 != (_Base_ptr)0x0) {
          _Var2 = __k->rowIndex_;
          p_Var10 = p_Var13;
          do {
            bVar7 = p_Var9[1]._M_color < _Var2;
            if (!bVar7) {
              p_Var10 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[bVar7];
          } while (p_Var9 != (_Base_ptr)0x0);
          if ((p_Var10 != p_Var13) && (p_Var10[1]._M_color <= _Var2)) {
            p_Var13 = p_Var10;
          }
        }
        pVar14 = std::
                 _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 ::equal_range((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                                *)&p_Var13[1]._M_parent,__k);
        std::
        _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                        *)&p_Var13[1]._M_parent,(_Base_ptr)pVar14.first._M_node,
                       (_Base_ptr)pVar14.second._M_node);
      }
      operator_delete(__k,8);
      ppEVar11 = ppEVar11 + 1;
    } while (ppEVar11 != ppEVar4);
    ppEVar11 = pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pVVar3[3].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8) != ppEVar11) {
      *(pointer *)
       ((long)&pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl + 8) = ppEVar11;
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&pVVar3[3].erasedValues_._M_h);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)(pVVar3 + 3),&setcont);
  local_328._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_2b0,local_328);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x350);
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((int)local_2a0 - (int)local_2b0) * 8 + local_298;
  if ((int)uVar12 < 0) {
    ppEVar11 = *(pointer *)
                ((long)&pVVar3[3].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8);
    if (ppEVar11 ==
        pVVar3[3].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_328._16_8_ = (_Bit_type *)0x0;
      EStack_310.super_Entry_column_index_option.columnIndex_ = 0;
      EStack_310.rowIndex_ = 0;
      local_328._0_4_ = 0;
      local_328._4_4_ = 0;
      local_328._8_8_ = 0;
      local_308.super_Entry_column_index_option.columnIndex_ = 0;
      local_308.rowIndex_ = 0;
      goto LAB_0017ce98;
    }
    uVar12 = ppEVar11[-1]->rowIndex_ + 1;
  }
  local_2d8 = (undefined **)((ulong)local_2d8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_328,(long)(int)uVar12,(bool *)&local_2d8,
             (allocator_type *)&local_2f0);
  ppEVar11 = pVVar3[3].column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar11 !=
      *(pointer *)
       ((long)&pVVar3[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl + 8)) {
    do {
      if (uVar12 <= (*ppEVar11)->rowIndex_) break;
      local_2d8 = (undefined **)CONCAT44(local_2d8._4_4_,(*ppEVar11)->rowIndex_);
      cVar8 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&pVVar3[3].erasedValues_._M_h,(key_type *)&local_2d8);
      if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        puVar1 = (ulong *)(local_328._0_8_ + (ulong)((*ppEVar11)->rowIndex_ >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar11)->rowIndex_ & 0x3f);
      }
      ppEVar11 = ppEVar11 + 1;
    } while (ppEVar11 !=
             *(pointer *)
              ((long)&pVVar3[3].column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl + 8));
  }
LAB_0017ce98:
  __last1_04.super__Bit_iterator_base._M_offset =
       EStack_310.super_Entry_column_index_option.columnIndex_;
  __last1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._16_8_;
  if ((ulong)EStack_310.super_Entry_column_index_option.columnIndex_ +
      (local_328._16_8_ - local_328._0_8_) * 8 ==
      (ulong)local_298 + (local_2a0 - (long)local_2b0) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_328._0_8_;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_2b0;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar7 = false;
  }
  pvVar6 = local_278;
  local_270 = (undefined **)CONCAT71(local_270._1_7_,bVar7);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_2f0 = "matrix[3].get_content(veccont.size()) == veccont";
  local_2e8 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002093b0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = &local_2f0;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_270,&local_2d8,&local_1f0,0x350,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_260);
  if ((Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )local_328._0_8_ !=
      (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_308 - local_328._0_8_);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x352);
  local_268 = local_268 & 0xffffffffffffff00;
  local_270 = &PTR__lazy_ostream_00209440;
  sStack_260.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_258 = "";
  pVVar3 = (pvVar6->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = ((long)*(pointer *)
                      ((long)&pVVar3[3].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar3[3].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar3[3].erasedValues_._M_h._M_element_count;
  local_2f0 = (char *)CONCAT71(local_2f0._1_7_,local_2b8 == 4);
  local_2f4 = 4;
  local_2e8 = (char *)0x0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_280 = &local_2b8;
  local_328._8_8_ = local_328._8_8_ & 0xffffffffffffff00;
  local_328._0_8_ = &PTR__lazy_ostream_00209400;
  local_328._16_8_ = &boost::unit_test::lazy_ostream::inst;
  EStack_310 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                )&local_280;
  local_288 = &local_2f4;
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_002096c0;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2c0 = (char **)&local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  if (local_2b0 != (void *)0x0) {
    operator_delete(local_2b0,local_290 - (long)local_2b0);
  }
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  ::~_Rb_tree(&setcont._M_t);
  return;
}

Assistant:

void column_test_base_z2_operators(std::vector<Column>& matrix) {
  std::set<typename Column::Entry> setcont;
  std::vector<bool> veccont;

  setcont = {0, 1, 2, 5, 6};
  matrix[0] += setcont;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  setcont = {0, 1, 2, 5, 6};
  matrix[1] += setcont;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(1, setcont);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  setcont = {};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  setcont = {2, 3, 6};
  matrix[5].multiply_source_and_add(setcont, 1);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  setcont = {0, 1, 3, 5};
  matrix[3].multiply_target_and_add(0, setcont);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}